

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O3

tsd_t * duckdb_je_tsd_fetch_slow(tsd_t *tsd,_Bool minimal)

{
  uint8_t uVar1;
  
  switch((tsd->state).repr) {
  case '\x02':
    duckdb_je_tsd_slow_update(tsd);
    break;
  case '\x03':
    uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_min_init_state_nfetched +
            '\x01';
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_min_init_state_nfetched = uVar1;
    if (!minimal || uVar1 == 0x80) {
      duckdb_je_tsd_state_set(tsd,'\0');
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + -1;
      duckdb_je_tsd_slow_update(tsd);
      tsd_data_init(tsd);
    }
    break;
  case '\x04':
    duckdb_je_tsd_fetch_slow_cold_3();
    break;
  case '\x06':
    if (minimal) {
      duckdb_je_tsd_fetch_slow_cold_2();
    }
    else if (duckdb_je_tsd_booted) {
      duckdb_je_tsd_fetch_slow_cold_1();
    }
  }
  return tsd;
}

Assistant:

tsd_t *
tsd_fetch_slow(tsd_t *tsd, bool minimal) {
	assert(!tsd_fast(tsd));

	if (tsd_state_get(tsd) == tsd_state_nominal_slow) {
		/*
		 * On slow path but no work needed.  Note that we can't
		 * necessarily *assert* that we're slow, because we might be
		 * slow because of an asynchronous modification to global state,
		 * which might be asynchronously modified *back*.
		 */
	} else if (tsd_state_get(tsd) == tsd_state_nominal_recompute) {
		tsd_slow_update(tsd);
	} else if (tsd_state_get(tsd) == tsd_state_uninitialized) {
		if (!minimal) {
			if (tsd_booted) {
				tsd_state_set(tsd, tsd_state_nominal);
				tsd_slow_update(tsd);
				/* Trigger cleanup handler registration. */
				tsd_set(tsd);
				tsd_data_init(tsd);
			}
		} else {
			tsd_state_set(tsd, tsd_state_minimal_initialized);
			tsd_set(tsd);
			tsd_data_init_nocleanup(tsd);
			*tsd_min_init_state_nfetchedp_get(tsd) = 1;
		}
	} else if (tsd_state_get(tsd) == tsd_state_minimal_initialized) {
		/*
		 * If a thread only ever deallocates (e.g. dedicated reclamation
		 * threads), we want to help it to eventually escape the slow
		 * path (caused by the minimal initialized state).  The nfetched
		 * counter tracks the number of times the tsd has been accessed
		 * under the min init state, and triggers the switch to nominal
		 * once reached the max allowed count.
		 *
		 * This means at most 128 deallocations stay on the slow path.
		 *
		 * Also see comments in free_default().
		 */
		uint8_t *nfetched = tsd_min_init_state_nfetchedp_get(tsd);
		assert(*nfetched >= 1);
		(*nfetched)++;
		if (!minimal || *nfetched == TSD_MIN_INIT_STATE_MAX_FETCHED) {
			/* Switch to fully initialized. */
			tsd_state_set(tsd, tsd_state_nominal);
			assert(*tsd_reentrancy_levelp_get(tsd) >= 1);
			(*tsd_reentrancy_levelp_get(tsd))--;
			tsd_slow_update(tsd);
			tsd_data_init(tsd);
		} else {
			assert_tsd_data_cleanup_done(tsd);
		}
	} else if (tsd_state_get(tsd) == tsd_state_purgatory) {
		tsd_state_set(tsd, tsd_state_reincarnated);
		tsd_set(tsd);
		tsd_data_init_nocleanup(tsd);
	} else {
		assert(tsd_state_get(tsd) == tsd_state_reincarnated);
	}

	return tsd;
}